

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TablePrinter * Catch::operator<<(TablePrinter *tp)

{
  ostream *poVar1;
  pointer pCVar2;
  int __oflag;
  int iVar3;
  value_type *__file;
  long lVar4;
  __string_type *__a;
  value_type colInfo;
  string padding;
  __string_type colStr;
  
  std::__cxx11::stringbuf::str();
  __a = &padding;
  std::__cxx11::string::string<std::allocator<char>>((string *)&colInfo,"",(allocator<char> *)__a);
  __file = &colInfo;
  std::__cxx11::stringbuf::str((string *)&tp->field_0x28);
  std::__cxx11::string::~string((string *)&colInfo);
  TablePrinter::open(tp,(char *)__file,__oflag);
  iVar3 = tp->m_currentColumn;
  pCVar2 = (tp->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (iVar3 == (int)(((long)(tp->m_columnInfos).
                            super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0x28) + -1)
  {
    tp->m_currentColumn = -1;
    std::operator<<((ostream *)tp->m_os,'\n');
    iVar3 = tp->m_currentColumn;
    pCVar2 = (tp->m_columnInfos).
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  tp->m_currentColumn = iVar3 + 1;
  anon_unknown_2::ColumnInfo::ColumnInfo(&colInfo,pCVar2 + (iVar3 + 1));
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  lVar4 = (long)colInfo.width - (colStr._M_string_length + 1);
  if ((ulong)(long)colInfo.width < colStr._M_string_length + 1 || lVar4 == 0) {
    padding._M_string_length = 0;
    padding.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&padding,(char)lVar4);
  }
  if (colInfo.justification == Left) {
    poVar1 = std::operator<<((ostream *)tp->m_os,(string *)&colStr);
  }
  else {
    poVar1 = std::operator<<((ostream *)tp->m_os,(string *)&padding);
    __a = &colStr;
  }
  poVar1 = std::operator<<(poVar1,(string *)__a);
  std::operator<<(poVar1,' ');
  std::__cxx11::string::~string((string *)&padding);
  std::__cxx11::string::~string((string *)&colInfo);
  std::__cxx11::string::~string((string *)&colStr);
  return tp;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, ColumnBreak) {
        auto colStr = tp.m_oss.str();
        const auto strSize = colStr.size();
        tp.m_oss.str("");
        tp.open();
        if (tp.m_currentColumn == static_cast<int>(tp.m_columnInfos.size() - 1)) {
            tp.m_currentColumn = -1;
            tp.m_os << '\n';
        }
        tp.m_currentColumn++;

        auto colInfo = tp.m_columnInfos[tp.m_currentColumn];
        auto padding = (strSize + 1 < static_cast<std::size_t>(colInfo.width))
            ? std::string(colInfo.width - (strSize + 1), ' ')
            : std::string();
        if (colInfo.justification == ColumnInfo::Left)
            tp.m_os << colStr << padding << ' ';
        else
            tp.m_os << padding << colStr << ' ';
        return tp;
    }